

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void CPP::generateMultiDirectiveBegin(QTextStream *outputStream,QSet<QString> *directives)

{
  byte bVar1;
  Data *pDVar2;
  Entry *pEVar3;
  iterator iVar4;
  iterator iVar5;
  QTextStream *pQVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long lVar10;
  long in_FS_OFFSET;
  qtConfig local_58;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (directives->q_hash).d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    if ((pDVar2 == (Data *)0x0) || (pDVar2->size != 1)) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QString>::values((QList<QString> *)&local_48,directives);
      iVar4 = QList<QString>::begin((QList<QString> *)&local_48);
      iVar5 = QList<QString>::end((QList<QString> *)&local_48);
      if (iVar4.i != iVar5.i) {
        uVar8 = ((long)iVar5.i - (long)iVar4.i >> 3) * -0x5555555555555555;
        lVar10 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar4.i,iVar5.i,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar4.i,iVar5.i);
      }
      pQVar6 = (QTextStream *)QTextStream::operator<<(outputStream,"#if ");
      local_58.super_StringViewStreamable.m_parameter.m_data = ((local_48.ptr)->d).ptr;
      local_58.super_StringViewStreamable.m_parameter.m_size = ((local_48.ptr)->d).size;
      language::operator<<(pQVar6,&local_58);
      if ((undefined1 *)0x1 < (ulong)local_48.size) {
        puVar9 = (undefined1 *)(local_48.size + -1);
        lVar10 = 0x28;
        do {
          pQVar6 = (QTextStream *)QTextStream::operator<<(outputStream," || ");
          local_58.super_StringViewStreamable.m_parameter.m_data =
               *(storage_type_conflict **)((long)local_48.ptr + lVar10 + -8);
          local_58.super_StringViewStreamable.m_parameter.m_size =
               *(qsizetype *)((long)&((local_48.ptr)->d).d + lVar10);
          language::operator<<(pQVar6,&local_58);
          lVar10 = lVar10 + 0x18;
          puVar9 = puVar9 + -1;
        } while (puVar9 != (undefined1 *)0x0);
      }
      Qt::endl(outputStream);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    }
    else {
      if (pDVar2->spans->offsets[0] == 0xff) {
        uVar8 = 1;
        do {
          uVar7 = uVar8;
          uVar8 = uVar7 + 1;
        } while (pDVar2->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
      }
      else {
        uVar7 = 0;
      }
      pEVar3 = pDVar2->spans[uVar7 >> 7].entries;
      bVar1 = pDVar2->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f];
      local_48.ptr = *(QString **)(pEVar3[bVar1].storage.data + 8);
      local_48.d = *(Data **)(pEVar3[bVar1].storage.data + 0x10);
      language::operator<<(outputStream,(openQtConfig *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void generateMultiDirectiveBegin(QTextStream &outputStream, const QSet<QString> &directives)
{
    if (directives.isEmpty())
        return;

    if (directives.size() == 1) {
        outputStream << language::openQtConfig(*directives.cbegin());
        return;
    }

    auto list = directives.values();
    // sort (always generate in the same order):
    std::sort(list.begin(), list.end());

    outputStream << "#if " << language::qtConfig(list.constFirst());
    for (qsizetype i = 1, size = list.size(); i < size; ++i)
        outputStream << " || " << language::qtConfig(list.at(i));
    outputStream << Qt::endl;
}